

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void jsonnet_json_destroy(JsonnetVm *vm,JsonnetJsonValue *v)

{
  if (v != (JsonnetJsonValue *)0x0) {
    JsonnetJsonValue::~JsonnetJsonValue(v);
  }
  operator_delete(v,0x78);
  return;
}

Assistant:

void jsonnet_json_destroy(JsonnetVm *vm, JsonnetJsonValue *v)
{
    (void)vm;
    delete v;
}